

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_relation(compiler_state_t *cstate,int code,arth *a0,arth *a1,int reversed)

{
  slist *s0_00;
  slist *s0_01;
  slist *s1_00;
  block *local_58;
  block *tmp;
  block *b;
  slist *s2;
  slist *s1;
  slist *s0;
  int reversed_local;
  arth *a1_local;
  arth *a0_local;
  int code_local;
  compiler_state_t *cstate_local;
  
  s0_00 = xfer_to_x(cstate,a1);
  s0_01 = xfer_to_a(cstate,a0);
  if (code == 0x10) {
    s1_00 = new_stmt(cstate,0x1c);
    tmp = new_block(cstate,0x15);
    sappend(s0_01,s1_00);
  }
  else {
    tmp = new_block(cstate,code | 0xd);
  }
  if (reversed != 0) {
    gen_not(tmp);
  }
  sappend(s0_00,s0_01);
  sappend(a1->s,s0_00);
  sappend(a0->s,a1->s);
  tmp->stmts = a0->s;
  free_reg(cstate,a0->regno);
  free_reg(cstate,a1->regno);
  if (a0->b == (block *)0x0) {
    local_58 = a1->b;
  }
  else if (a1->b == (block *)0x0) {
    local_58 = a0->b;
  }
  else {
    local_58 = a1->b;
    gen_and(a0->b,local_58);
  }
  if (local_58 != (block *)0x0) {
    gen_and(local_58,tmp);
  }
  return tmp;
}

Assistant:

struct block *
gen_relation(compiler_state_t *cstate, int code, struct arth *a0,
    struct arth *a1, int reversed)
{
	struct slist *s0, *s1, *s2;
	struct block *b, *tmp;

	s0 = xfer_to_x(cstate, a1);
	s1 = xfer_to_a(cstate, a0);
	if (code == BPF_JEQ) {
		s2 = new_stmt(cstate, BPF_ALU|BPF_SUB|BPF_X);
		b = new_block(cstate, JMP(code));
		sappend(s1, s2);
	}
	else
		b = new_block(cstate, BPF_JMP|code|BPF_X);
	if (reversed)
		gen_not(b);

	sappend(s0, s1);
	sappend(a1->s, s0);
	sappend(a0->s, a1->s);

	b->stmts = a0->s;

	free_reg(cstate, a0->regno);
	free_reg(cstate, a1->regno);

	/* 'and' together protocol checks */
	if (a0->b) {
		if (a1->b) {
			gen_and(a0->b, tmp = a1->b);
		}
		else
			tmp = a0->b;
	} else
		tmp = a1->b;

	if (tmp)
		gen_and(tmp, b);

	return b;
}